

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[23],char_const*,char[64],unsigned_long,char[15]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [23],char **Args_1,
          char (*Args_2) [64],unsigned_long *Args_3,char (*Args_4) [15])

{
  stringstream local_1c0 [8];
  stringstream ss;
  char (*Args_local_4) [15];
  unsigned_long *Args_local_3;
  char (*Args_local_2) [64];
  char **Args_local_1;
  char (*Args_local) [23];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[23],char_const*,char[64],unsigned_long,char[15]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [23])this,(char **)Args,(char (*) [64])Args_1,(unsigned_long *)Args_2,
             (char (*) [15])Args_3);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}